

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O2

void __thiscall
L13_3::BankAccountPlus::BankAccountPlus
          (BankAccountPlus *this,BankAccount *ba,double max_loan,double rate)

{
  Account::Account(&this->super_Account,&ba->super_Account);
  (this->super_Account)._vptr_Account = (_func_int **)&PTR_withdraw_0012f380;
  this->_max_loan = max_loan;
  this->_rate = rate;
  this->_loan = 0.0;
  return;
}

Assistant:

BankAccountPlus::BankAccountPlus(const BankAccount &ba, double max_loan, double rate): Account(ba) {
        _max_loan = max_loan;
        _rate = rate;
        _loan = 0;
    }